

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [14];
  undefined1 auVar33 [12];
  unkbyte10 Var34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [14];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar37;
  undefined4 uVar38;
  uint uVar39;
  long lVar40;
  long lVar41;
  Scene *pSVar42;
  RTCRayN *pRVar43;
  RTCFilterFunctionN p_Var44;
  int iVar45;
  int iVar46;
  RTCIntersectArguments *pRVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  byte bVar56;
  char cVar57;
  byte bVar85;
  byte bVar87;
  char cVar89;
  char cVar90;
  char cVar91;
  char cVar92;
  byte bVar94;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  char cVar86;
  char cVar88;
  undefined1 auVar65 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar84;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar113;
  float fVar129;
  float fVar130;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar131;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar120;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar154;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar155;
  float fVar164;
  float fVar165;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar166;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar173;
  float fVar175;
  undefined1 auVar169 [16];
  float fVar174;
  float fVar176;
  float fVar177;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar179 [16];
  float fVar183;
  uint uVar184;
  float fVar185;
  uint uVar186;
  float fVar187;
  uint uVar188;
  float fVar189;
  uint uVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar196 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  vint<4> sy;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  vbool<4> valid;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  undefined4 uStack_1338;
  float fStack_1334;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1288 [4];
  float local_1278 [4];
  float local_1268 [4];
  float local_1258 [4];
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [16];
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  int local_11e8;
  int iStack_11e4;
  int iStack_11e0;
  int iStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  int local_11b8;
  int iStack_11b4;
  int iStack_11b0;
  int iStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  ulong local_1180;
  ulong local_1178;
  StackItemT<embree::NodeRefPtr<4>_> *local_1170;
  ulong local_1168;
  ulong local_1160;
  ulong local_1158;
  ulong local_1150;
  ulong local_1148;
  ulong local_1140;
  ulong local_1138;
  long local_1130;
  ulong local_1128;
  ulong local_1120;
  ulong local_1118;
  long local_1110;
  ulong local_1108;
  long local_1100;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  vint<4> sx;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  uint local_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined8 local_fa8;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar66 [16];
  undefined1 auVar58 [11];
  undefined1 auVar67 [16];
  undefined1 auVar73 [16];
  undefined1 auVar59 [12];
  undefined1 auVar68 [16];
  undefined1 auVar60 [13];
  undefined1 auVar69 [16];
  undefined1 auVar74 [16];
  undefined1 auVar71 [16];
  undefined1 auVar70 [16];
  undefined2 uVar93;
  
  local_1170 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_11f8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1228 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10b8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar38 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_10b4 = local_10b8;
  fStack_10b0 = local_10b8;
  fStack_10ac = local_10b8;
  local_10c8._4_4_ = uVar38;
  local_10c8._0_4_ = uVar38;
  fStack_10c0 = (float)uVar38;
  fStack_10bc = (float)uVar38;
  local_10d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fStack_10d4 = local_10d8;
  fStack_10d0 = local_10d8;
  fStack_10cc = local_10d8;
  local_10e8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_10e4 = local_10e8;
  fStack_10e0 = local_10e8;
  fStack_10dc = local_10e8;
  local_1178 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1180 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1188 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_10f8 = (tray->tnear).field_0.i[k];
  iStack_10f4 = local_10f8;
  iStack_10f0 = local_10f8;
  iStack_10ec = local_10f8;
  local_11e8 = (tray->tfar).field_0.i[k];
  iStack_11e4 = local_11e8;
  iStack_11e0 = local_11e8;
  iStack_11dc = local_11e8;
  local_1140 = local_1178 >> 2;
  local_1118 = local_1178 ^ 0x10;
  local_1148 = (local_1178 ^ 0x10) >> 2;
  local_1150 = local_1180 >> 2;
  local_1120 = local_1180 ^ 0x10;
  local_1158 = (local_1180 ^ 0x10) >> 2;
  local_1160 = local_1188 >> 2;
  local_1128 = local_1188 ^ 0x10;
  local_1168 = (local_1188 ^ 0x10) >> 2;
  lVar40 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_11f4 = local_11f8;
  fStack_11f0 = local_11f8;
  fStack_11ec = local_11f8;
  fStack_1224 = local_1228;
  fStack_1220 = local_1228;
  fStack_121c = local_1228;
  uVar55 = local_1178;
  uVar48 = local_1188;
  uVar52 = local_1180;
  fVar216 = local_1228;
  fVar154 = local_1228;
  fVar195 = local_1228;
  fVar191 = local_1228;
  fVar197 = local_11f8;
  fVar194 = local_11f8;
  fVar168 = local_11f8;
  fVar174 = local_11f8;
  while (local_1170 != stack) {
    pSVar37 = local_1170 + -1;
    local_1170 = local_1170 + -1;
    if ((float)pSVar37->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar37->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar50 = (local_1170->ptr).ptr;
      do {
        if ((uVar50 & 8) == 0) {
          pfVar4 = (float *)(uVar50 + 0x20 + uVar55);
          auVar115._0_4_ = (*pfVar4 - fVar197) * (float)local_10c8._0_4_;
          auVar115._4_4_ = (pfVar4[1] - fVar194) * (float)local_10c8._4_4_;
          auVar115._8_4_ = (pfVar4[2] - fVar168) * fStack_10c0;
          auVar115._12_4_ = (pfVar4[3] - fVar174) * fStack_10bc;
          pfVar4 = (float *)(uVar50 + 0x20 + uVar52);
          auVar157._0_4_ = (*pfVar4 - fVar216) * local_10d8;
          auVar157._4_4_ = (pfVar4[1] - fVar154) * fStack_10d4;
          auVar157._8_4_ = (pfVar4[2] - fVar195) * fStack_10d0;
          auVar157._12_4_ = (pfVar4[3] - fVar191) * fStack_10cc;
          auVar61 = maxps(auVar115,auVar157);
          pfVar4 = (float *)(uVar50 + 0x20 + uVar48);
          auVar95._0_4_ = (*pfVar4 - local_10b8) * local_10e8;
          auVar95._4_4_ = (pfVar4[1] - fStack_10b4) * fStack_10e4;
          auVar95._8_4_ = (pfVar4[2] - fStack_10b0) * fStack_10e0;
          auVar95._12_4_ = (pfVar4[3] - fStack_10ac) * fStack_10dc;
          pfVar4 = (float *)(uVar50 + 0x20 + local_1118);
          auVar114._0_4_ = (*pfVar4 - fVar197) * (float)local_10c8._0_4_;
          auVar114._4_4_ = (pfVar4[1] - fVar194) * (float)local_10c8._4_4_;
          auVar114._8_4_ = (pfVar4[2] - fVar168) * fStack_10c0;
          auVar114._12_4_ = (pfVar4[3] - fVar174) * fStack_10bc;
          pfVar4 = (float *)(uVar50 + 0x20 + local_1120);
          auVar132._0_4_ = (*pfVar4 - fVar216) * local_10d8;
          auVar132._4_4_ = (pfVar4[1] - fVar154) * fStack_10d4;
          auVar132._8_4_ = (pfVar4[2] - fVar195) * fStack_10d0;
          auVar132._12_4_ = (pfVar4[3] - fVar191) * fStack_10cc;
          auVar115 = minps(auVar114,auVar132);
          pfVar4 = (float *)(uVar50 + 0x20 + local_1128);
          auVar133._0_4_ = (*pfVar4 - local_10b8) * local_10e8;
          auVar133._4_4_ = (pfVar4[1] - fStack_10b4) * fStack_10e4;
          auVar133._8_4_ = (pfVar4[2] - fStack_10b0) * fStack_10e0;
          auVar133._12_4_ = (pfVar4[3] - fStack_10ac) * fStack_10dc;
          auVar96._4_4_ = iStack_10f4;
          auVar96._0_4_ = local_10f8;
          auVar96._8_4_ = iStack_10f0;
          auVar96._12_4_ = iStack_10ec;
          auVar96 = maxps(auVar95,auVar96);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar61,auVar96);
          auVar61._4_4_ = iStack_11e4;
          auVar61._0_4_ = local_11e8;
          auVar61._8_4_ = iStack_11e0;
          auVar61._12_4_ = iStack_11dc;
          auVar61 = minps(auVar133,auVar61);
          auVar61 = minps(auVar115,auVar61);
          auVar148._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar61._4_4_);
          auVar148._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar61._0_4_);
          auVar148._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar61._8_4_);
          auVar148._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar61._12_4_);
          uVar38 = movmskps((int)local_1128,auVar148);
          local_1108 = CONCAT44((int)(local_1128 >> 0x20),uVar38);
        }
        if ((uVar50 & 8) == 0) {
          if (local_1108 == 0) {
            iVar45 = 4;
          }
          else {
            uVar49 = uVar50 & 0xfffffffffffffff0;
            lVar41 = 0;
            if (local_1108 != 0) {
              for (; (local_1108 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
              }
            }
            iVar45 = 0;
            uVar9 = *(ulong *)(uVar49 + lVar41 * 8);
            uVar53 = local_1108 - 1 & local_1108;
            uVar50 = uVar9;
            if (uVar53 != 0) {
              uVar39 = tNear.field_0.i[lVar41];
              lVar41 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                }
              }
              uVar50 = *(ulong *)(uVar49 + lVar41 * 8);
              uVar184 = tNear.field_0.i[lVar41];
              uVar53 = uVar53 - 1 & uVar53;
              if (uVar53 == 0) {
                if (uVar39 < uVar184) {
                  (local_1170->ptr).ptr = uVar50;
                  local_1170->dist = uVar184;
                  uVar50 = uVar9;
                  local_1170 = local_1170 + 1;
                }
                else {
                  (local_1170->ptr).ptr = uVar9;
                  local_1170->dist = uVar39;
                  local_1170 = local_1170 + 1;
                }
              }
              else {
                auVar62._8_4_ = uVar39;
                auVar62._0_8_ = uVar9;
                auVar62._12_4_ = 0;
                auVar97._8_4_ = uVar184;
                auVar97._0_8_ = uVar50;
                auVar97._12_4_ = 0;
                lVar41 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                  }
                }
                uVar50 = *(ulong *)(uVar49 + lVar41 * 8);
                iVar46 = tNear.field_0.i[lVar41];
                auVar116._8_4_ = iVar46;
                auVar116._0_8_ = uVar50;
                auVar116._12_4_ = 0;
                auVar134._8_4_ = -(uint)((int)uVar39 < (int)uVar184);
                uVar53 = uVar53 - 1 & uVar53;
                fVar216 = local_1228;
                fVar154 = fStack_1224;
                fVar195 = fStack_1220;
                fVar191 = fStack_121c;
                if (uVar53 == 0) {
                  auVar134._4_4_ = auVar134._8_4_;
                  auVar134._0_4_ = auVar134._8_4_;
                  auVar134._12_4_ = auVar134._8_4_;
                  auVar61 = auVar62 & auVar134 | ~auVar134 & auVar97;
                  auVar96 = auVar97 & auVar134 | ~auVar134 & auVar62;
                  auVar135._8_4_ = -(uint)(auVar61._8_4_ < iVar46);
                  auVar135._0_8_ = CONCAT44(auVar135._8_4_,auVar135._8_4_);
                  auVar135._12_4_ = auVar135._8_4_;
                  uVar50 = ~auVar135._0_8_ & uVar50 | auVar61._0_8_ & auVar135._0_8_;
                  auVar61 = auVar116 & auVar135 | ~auVar135 & auVar61;
                  auVar63._8_4_ = -(uint)(auVar96._8_4_ < auVar61._8_4_);
                  auVar63._4_4_ = auVar63._8_4_;
                  auVar63._0_4_ = auVar63._8_4_;
                  auVar63._12_4_ = auVar63._8_4_;
                  *local_1170 = (StackItemT<embree::NodeRefPtr<4>_>)
                                (~auVar63 & auVar96 | auVar61 & auVar63);
                  local_1170[1] =
                       (StackItemT<embree::NodeRefPtr<4>_>)(auVar96 & auVar63 | ~auVar63 & auVar61);
                  local_1170 = local_1170 + 2;
                }
                else {
                  lVar41 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                    }
                  }
                  iVar7 = tNear.field_0.i[lVar41];
                  auVar147._8_4_ = iVar7;
                  auVar147._0_8_ = *(undefined8 *)(uVar49 + lVar41 * 8);
                  auVar147._12_4_ = 0;
                  auVar136._4_4_ = auVar134._8_4_;
                  auVar136._0_4_ = auVar134._8_4_;
                  auVar136._8_4_ = auVar134._8_4_;
                  auVar136._12_4_ = auVar134._8_4_;
                  auVar61 = auVar62 & auVar136 | ~auVar136 & auVar97;
                  auVar96 = auVar97 & auVar136 | ~auVar136 & auVar62;
                  auVar156._0_4_ = -(uint)(iVar46 < iVar7);
                  auVar156._4_4_ = -(uint)(iVar46 < iVar7);
                  auVar156._8_4_ = -(uint)(iVar46 < iVar7);
                  auVar156._12_4_ = -(uint)(iVar46 < iVar7);
                  auVar115 = auVar116 & auVar156 | ~auVar156 & auVar147;
                  auVar157 = ~auVar156 & auVar116 | auVar147 & auVar156;
                  auVar117._8_4_ = -(uint)(auVar96._8_4_ < auVar157._8_4_);
                  auVar117._4_4_ = auVar117._8_4_;
                  auVar117._0_4_ = auVar117._8_4_;
                  auVar117._12_4_ = auVar117._8_4_;
                  auVar148 = auVar96 & auVar117 | ~auVar117 & auVar157;
                  auVar98._8_4_ = -(uint)(auVar61._8_4_ < auVar115._8_4_);
                  auVar98._0_8_ = CONCAT44(auVar98._8_4_,auVar98._8_4_);
                  auVar98._12_4_ = auVar98._8_4_;
                  uVar50 = auVar61._0_8_ & auVar98._0_8_ | ~auVar98._0_8_ & auVar115._0_8_;
                  auVar61 = ~auVar98 & auVar61 | auVar115 & auVar98;
                  auVar64._8_4_ = -(uint)(auVar61._8_4_ < auVar148._8_4_);
                  auVar64._4_4_ = auVar64._8_4_;
                  auVar64._0_4_ = auVar64._8_4_;
                  auVar64._12_4_ = auVar64._8_4_;
                  *local_1170 = (StackItemT<embree::NodeRefPtr<4>_>)
                                (~auVar117 & auVar96 | auVar157 & auVar117);
                  local_1170[1] =
                       (StackItemT<embree::NodeRefPtr<4>_>)(~auVar64 & auVar61 | auVar148 & auVar64)
                  ;
                  local_1170[2] =
                       (StackItemT<embree::NodeRefPtr<4>_>)(auVar61 & auVar64 | ~auVar64 & auVar148)
                  ;
                  local_1170 = local_1170 + 3;
                  fVar197 = local_11f8;
                  fVar194 = fStack_11f4;
                  fVar168 = fStack_11f0;
                  fVar174 = fStack_11ec;
                }
              }
            }
          }
        }
        else {
          iVar45 = 6;
        }
      } while (iVar45 == 0);
      if (iVar45 == 6) {
        local_1130 = (ulong)((uint)uVar50 & 0xf) - 8;
        if (local_1130 != 0) {
          local_1110 = 0;
          local_1138 = uVar50 & 0xfffffffffffffff0;
          do {
            lVar41 = local_1110 * 0x58;
            local_1100 = local_1138 + lVar41;
            uVar6 = *(undefined8 *)(local_1138 + 0x20 + lVar41);
            uVar38 = *(undefined4 *)(local_1138 + 0x24 + lVar41);
            bVar94 = (byte)uVar6;
            bVar56 = (byte)uVar38;
            bVar13 = (byte)((ulong)uVar6 >> 8);
            bVar85 = (byte)((uint)uVar38 >> 8);
            bVar14 = (byte)((ulong)uVar6 >> 0x10);
            bVar87 = (byte)((uint)uVar38 >> 0x10);
            bVar16 = (byte)((uint)uVar38 >> 0x18);
            bVar15 = (byte)((ulong)uVar6 >> 0x18);
            cVar57 = -((byte)((bVar94 < bVar56) * bVar94 | (bVar94 >= bVar56) * bVar56) == bVar94);
            cVar86 = -((byte)((bVar13 < bVar85) * bVar13 | (bVar13 >= bVar85) * bVar85) == bVar13);
            cVar88 = -((byte)((bVar14 < bVar87) * bVar14 | (bVar14 >= bVar87) * bVar87) == bVar14);
            cVar89 = -((byte)((bVar15 < bVar16) * bVar15 | (bVar15 >= bVar16) * bVar16) == bVar15);
            cVar90 = -((char)((ulong)uVar6 >> 0x20) == '\0');
            cVar91 = -((char)((ulong)uVar6 >> 0x28) == '\0');
            cVar92 = -((char)((ulong)uVar6 >> 0x30) == '\0');
            bVar94 = -((char)((ulong)uVar6 >> 0x38) == '\0');
            auVar66._0_9_ = CONCAT18(0xff,(ulong)bVar94 << 0x38);
            auVar58._0_10_ = CONCAT19(0xff,auVar66._0_9_);
            auVar58[10] = 0xff;
            auVar59[0xb] = 0xff;
            auVar59._0_11_ = auVar58;
            auVar60[0xc] = 0xff;
            auVar60._0_12_ = auVar59;
            auVar71[0xd] = 0xff;
            auVar71._0_13_ = auVar60;
            fVar216 = *(float *)(local_1138 + 0x38 + lVar41);
            fVar154 = *(float *)(local_1138 + 0x3c + lVar41);
            fVar195 = *(float *)(local_1138 + 0x44 + lVar41);
            uVar39 = *(uint *)(local_1140 + 0x20 + local_1100);
            auVar26[0xc] = (char)(uVar39 >> 0x18);
            auVar26._0_12_ = ZEXT712(0);
            uVar184 = *(uint *)(local_1148 + 0x20 + local_1100);
            auVar21[0xc] = (char)(uVar184 >> 0x18);
            auVar21._0_12_ = ZEXT712(0);
            fVar191 = *(float *)(local_1138 + 0x48 + lVar41);
            uVar186 = *(uint *)(local_1150 + 0x20 + local_1100);
            auVar22[0xc] = (char)(uVar186 >> 0x18);
            auVar22._0_12_ = ZEXT712(0);
            uVar188 = *(uint *)(local_1158 + 0x20 + local_1100);
            auVar23[0xc] = (char)(uVar188 >> 0x18);
            auVar23._0_12_ = ZEXT712(0);
            fVar197 = *(float *)(local_1138 + 0x4c + lVar41);
            uVar190 = *(uint *)(local_1160 + 0x20 + local_1100);
            auVar24[0xc] = (char)(uVar190 >> 0x18);
            auVar24._0_12_ = ZEXT712(0);
            uVar8 = *(uint *)(local_1168 + 0x20 + local_1100);
            auVar25[0xc] = (char)(uVar8 >> 0x18);
            auVar25._0_12_ = ZEXT712(0);
            fVar194 = *(float *)(local_1138 + 0x40 + lVar41);
            auVar99._0_4_ =
                 (((float)(uVar39 & 0xff) * fVar195 + fVar216) - local_11f8) *
                 (float)local_10c8._0_4_;
            auVar99._4_4_ =
                 (((float)(uVar39 >> 8 & 0xff) * fVar195 + fVar216) - fStack_11f4) *
                 (float)local_10c8._4_4_;
            auVar99._8_4_ =
                 (((float)(int)CONCAT32(auVar26._10_3_,(ushort)(byte)(uVar39 >> 0x10)) * fVar195 +
                  fVar216) - fStack_11f0) * fStack_10c0;
            auVar99._12_4_ =
                 (((float)(uint3)(auVar26._10_3_ >> 0x10) * fVar195 + fVar216) - fStack_11ec) *
                 fStack_10bc;
            auVar149._0_4_ =
                 (((float)(uVar186 & 0xff) * fVar191 + fVar154) - local_1228) * local_10d8;
            auVar149._4_4_ =
                 (((float)(uVar186 >> 8 & 0xff) * fVar191 + fVar154) - fStack_1224) * fStack_10d4;
            auVar149._8_4_ =
                 (((float)(int)CONCAT32(auVar22._10_3_,(ushort)(byte)(uVar186 >> 0x10)) * fVar191 +
                  fVar154) - fStack_1220) * fStack_10d0;
            auVar149._12_4_ =
                 (((float)(uint3)(auVar22._10_3_ >> 0x10) * fVar191 + fVar154) - fStack_121c) *
                 fStack_10cc;
            auVar61 = maxps(auVar99,auVar149);
            auVar118._0_4_ =
                 (((float)(uVar184 & 0xff) * fVar195 + fVar216) - local_11f8) *
                 (float)local_10c8._0_4_;
            auVar118._4_4_ =
                 (((float)(uVar184 >> 8 & 0xff) * fVar195 + fVar216) - fStack_11f4) *
                 (float)local_10c8._4_4_;
            auVar118._8_4_ =
                 (((float)(int)CONCAT32(auVar21._10_3_,(ushort)(byte)(uVar184 >> 0x10)) * fVar195 +
                  fVar216) - fStack_11f0) * fStack_10c0;
            auVar118._12_4_ =
                 (((float)(uint3)(auVar21._10_3_ >> 0x10) * fVar195 + fVar216) - fStack_11ec) *
                 fStack_10bc;
            auVar137._0_4_ =
                 (((float)(uVar188 & 0xff) * fVar191 + fVar154) - local_1228) * local_10d8;
            auVar137._4_4_ =
                 (((float)(uVar188 >> 8 & 0xff) * fVar191 + fVar154) - fStack_1224) * fStack_10d4;
            auVar137._8_4_ =
                 (((float)(int)CONCAT32(auVar23._10_3_,(ushort)(byte)(uVar188 >> 0x10)) * fVar191 +
                  fVar154) - fStack_1220) * fStack_10d0;
            auVar137._12_4_ =
                 (((float)(uint3)(auVar23._10_3_ >> 0x10) * fVar191 + fVar154) - fStack_121c) *
                 fStack_10cc;
            auVar96 = minps(auVar118,auVar137);
            auVar158._0_4_ =
                 (((float)(uVar190 & 0xff) * fVar197 + fVar194) - local_10b8) * local_10e8;
            auVar158._4_4_ =
                 (((float)(uVar190 >> 8 & 0xff) * fVar197 + fVar194) - fStack_10b4) * fStack_10e4;
            auVar158._8_4_ =
                 (((float)(int)CONCAT32(auVar24._10_3_,(ushort)(byte)(uVar190 >> 0x10)) * fVar197 +
                  fVar194) - fStack_10b0) * fStack_10e0;
            auVar158._12_4_ =
                 (((float)(uint3)(auVar24._10_3_ >> 0x10) * fVar197 + fVar194) - fStack_10ac) *
                 fStack_10dc;
            auVar31._4_4_ = iStack_10f4;
            auVar31._0_4_ = local_10f8;
            auVar31._8_4_ = iStack_10f0;
            auVar31._12_4_ = iStack_10ec;
            auVar115 = maxps(auVar158,auVar31);
            dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar61,auVar115);
            auVar169._0_4_ = (((float)(uVar8 & 0xff) * fVar197 + fVar194) - local_10b8) * local_10e8
            ;
            auVar169._4_4_ =
                 (((float)(uVar8 >> 8 & 0xff) * fVar197 + fVar194) - fStack_10b4) * fStack_10e4;
            auVar169._8_4_ =
                 (((float)(int)CONCAT32(auVar25._10_3_,(ushort)(byte)(uVar8 >> 0x10)) * fVar197 +
                  fVar194) - fStack_10b0) * fStack_10e0;
            auVar169._12_4_ =
                 (((float)(uint3)(auVar25._10_3_ >> 0x10) * fVar197 + fVar194) - fStack_10ac) *
                 fStack_10dc;
            auVar30._4_4_ = iStack_11e4;
            auVar30._0_4_ = local_11e8;
            auVar30._8_4_ = iStack_11e0;
            auVar30._12_4_ = iStack_11dc;
            auVar61 = minps(auVar169,auVar30);
            auVar61 = minps(auVar96,auVar61);
            auVar71[0xe] = bVar94;
            auVar71[0xf] = bVar94;
            auVar70._14_2_ = auVar71._14_2_;
            auVar70[0xd] = cVar92;
            auVar70._0_13_ = auVar60;
            auVar69._13_3_ = auVar70._13_3_;
            auVar69[0xc] = cVar92;
            auVar69._0_12_ = auVar59;
            auVar68._12_4_ = auVar69._12_4_;
            auVar68[0xb] = cVar91;
            auVar68._0_11_ = auVar58;
            auVar67._11_5_ = auVar68._11_5_;
            auVar67[10] = cVar91;
            auVar67._0_10_ = auVar58._0_10_;
            auVar66._10_6_ = auVar67._10_6_;
            auVar66[9] = cVar90;
            Var34 = CONCAT91(CONCAT81((long)(CONCAT72(auVar66._9_7_,CONCAT11(cVar90,bVar94)) >> 8),
                                      cVar89),cVar89);
            auVar33._2_10_ = Var34;
            auVar33[1] = cVar88;
            auVar33[0] = cVar88;
            auVar32._2_12_ = auVar33;
            auVar32[1] = cVar86;
            auVar32[0] = cVar86;
            auVar65._0_2_ = CONCAT11(cVar57,cVar57);
            auVar65._2_14_ = auVar32;
            uVar93 = (undefined2)Var34;
            auVar74._0_12_ = auVar65._0_12_;
            auVar74._12_2_ = uVar93;
            auVar74._14_2_ = uVar93;
            auVar73._12_4_ = auVar74._12_4_;
            auVar73._0_10_ = auVar65._0_10_;
            auVar73._10_2_ = auVar33._0_2_;
            auVar72._10_6_ = auVar73._10_6_;
            auVar72._0_8_ = auVar65._0_8_;
            auVar72._8_2_ = auVar33._0_2_;
            auVar35._4_8_ = auVar72._8_8_;
            auVar35._2_2_ = auVar32._0_2_;
            auVar35._0_2_ = auVar32._0_2_;
            uVar39 = CONCAT22(auVar65._0_2_,auVar65._0_2_);
            auVar100._0_4_ = -(uint)(dist.field_0._0_4_ <= auVar61._0_4_) & uVar39;
            auVar100._4_4_ = -(uint)(dist.field_0._4_4_ <= auVar61._4_4_) & auVar35._0_4_;
            auVar100._8_4_ = -(uint)(dist.field_0._8_4_ <= auVar61._8_4_) & auVar72._8_4_;
            auVar100._12_4_ = -(uint)(dist.field_0._12_4_ <= auVar61._12_4_) & auVar73._12_4_;
            uVar39 = movmskps((int)lVar41,auVar100);
            if (uVar39 != 0) {
              uVar55 = (ulong)(uVar39 & 0xff);
              do {
                lVar41 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                  }
                }
                fVar216 = *(float *)(ray + k * 4 + 0x80);
                if (*(float *)((long)&stack[-1].ptr.ptr + lVar41 * 4) <= fVar216) {
                  local_1218 = ZEXT416((uint)fVar216);
                  fVar154 = *(float *)(local_1100 + 0x50);
                  uVar39 = *(uint *)(local_1100 + 4 + lVar41 * 8);
                  pSVar42 = context->scene;
                  pGVar10 = (pSVar42->geometries).items[(uint)fVar154].ptr;
                  lVar11 = *(long *)&pGVar10->field_0x58;
                  lVar12 = *(long *)&pGVar10[1].time_range.upper;
                  lVar51 = (ulong)uVar39 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  uVar48 = *(ulong *)(local_1100 + lVar41 * 8);
                  auVar119._8_8_ = 0;
                  auVar119._0_8_ = uVar48;
                  auVar119 = auVar119 & _DAT_0201c980;
                  auVar27._10_2_ = 0;
                  auVar27._0_10_ = auVar119._0_10_;
                  auVar27._12_2_ = auVar119._6_2_;
                  auVar28._8_2_ = auVar119._4_2_;
                  auVar28._0_8_ = auVar119._0_8_;
                  auVar28._10_4_ = auVar27._10_4_;
                  auVar36._6_8_ = 0;
                  auVar36._0_6_ = auVar28._8_6_;
                  auVar29._4_2_ = auVar119._2_2_;
                  auVar29._0_4_ = auVar119._0_4_;
                  auVar29._6_8_ = SUB148(auVar36 << 0x40,6);
                  sx.field_0.i[0] = (int)auVar119._0_2_;
                  uVar52 = *(ulong *)(lVar11 + lVar51);
                  uVar50 = (ulong)(uint)((int)((ulong)(auVar119._0_4_ >> 0x10) * (uVar52 >> 0x20)) +
                                        (int)uVar52 + sx.field_0.i[0]);
                  p_Var44 = pGVar10[1].intersectionFilterN;
                  pfVar4 = (float *)(lVar12 + (long)p_Var44 * uVar50);
                  fVar195 = *pfVar4;
                  fVar191 = pfVar4[1];
                  local_11c8 = pfVar4[2];
                  pfVar4 = (float *)(lVar12 + (uVar50 + 1) * (long)p_Var44);
                  fVar197 = *pfVar4;
                  local_fb8 = pfVar4[1];
                  fStack_11c4 = pfVar4[2];
                  uVar52 = uVar52 >> 0x20;
                  lVar41 = uVar50 + uVar52 + 1;
                  pfVar4 = (float *)(lVar12 + (uVar50 + uVar52) * (long)p_Var44);
                  local_1358._0_4_ = *pfVar4;
                  local_11a8 = pfVar4[1];
                  local_fc8 = pfVar4[2];
                  pfVar4 = (float *)(lVar12 + lVar41 * (long)p_Var44);
                  local_1358._4_4_ = *pfVar4;
                  local_f98 = pfVar4[1];
                  fStack_fc4 = pfVar4[2];
                  uVar49 = (ulong)(-1 < (short)uVar48);
                  pfVar4 = (float *)(lVar12 + (uVar50 + uVar49 + 1) * (long)p_Var44);
                  lVar54 = uVar49 + lVar41;
                  pfVar1 = (float *)(lVar12 + lVar54 * (long)p_Var44);
                  fStack_f94 = pfVar1[1];
                  uVar49 = 0;
                  if (-1 < (short)(uVar48 >> 0x10)) {
                    uVar49 = uVar52;
                  }
                  pfVar2 = (float *)(lVar12 + (uVar50 + uVar52 + uVar49) * (long)p_Var44);
                  fStack_1344 = *pfVar2;
                  pfVar3 = (float *)(lVar12 + (lVar41 + uVar49) * (long)p_Var44);
                  local_1348 = *pfVar3;
                  fStack_f8c = pfVar3[1];
                  fStack_1334 = pfVar3[2];
                  lVar41 = lVar12 + (uVar49 + lVar54) * (long)p_Var44;
                  uStack_1338 = *(undefined4 *)(lVar41 + 8);
                  local_1208 = CONCAT44(*pfVar4,fVar197);
                  local_11f8 = *pfVar1;
                  fStack_11f4 = local_1358._4_4_;
                  local_fa8 = CONCAT44(*pfVar1,local_1358._4_4_);
                  fStack_f90 = *(float *)(lVar41 + 4);
                  fStack_fb4 = pfVar4[1];
                  fStack_fb0 = fStack_f94;
                  fStack_fac = local_f98;
                  fVar155 = fVar191 - local_fb8;
                  fVar164 = local_fb8 - pfVar4[1];
                  fVar165 = local_f98 - fStack_f94;
                  fVar166 = local_11a8 - local_f98;
                  local_1198 = CONCAT44(pfVar4[2],fStack_11c4);
                  local_1188 = CONCAT44(fStack_fc4,pfVar1[2]);
                  fVar204 = local_11c8 - fStack_11c4;
                  fVar206 = fStack_11c4 - pfVar4[2];
                  fVar208 = fStack_fc4 - pfVar1[2];
                  fVar210 = local_fc8 - fStack_fc4;
                  fStack_11a4 = local_f98;
                  fStack_11a0 = fStack_f8c;
                  fStack_119c = pfVar2[1];
                  fVar178 = local_11a8 - fVar191;
                  fVar180 = local_f98 - local_fb8;
                  fVar181 = fStack_f8c - local_f98;
                  fVar182 = pfVar2[1] - local_11a8;
                  fStack_fc0 = fStack_1334;
                  fStack_fbc = pfVar2[2];
                  fVar183 = local_fc8 - local_11c8;
                  fVar185 = fStack_fc4 - fStack_11c4;
                  fVar187 = fStack_1334 - fStack_fc4;
                  fVar189 = pfVar2[2] - local_fc8;
                  local_1258[0] = fVar204 * fVar178 - fVar155 * fVar183;
                  local_1258[1] = fVar206 * fVar180 - fVar164 * fVar185;
                  local_1258[2] = fVar208 * fVar181 - fVar165 * fVar187;
                  local_1258[3] = fVar210 * fVar182 - fVar166 * fVar189;
                  fVar167 = (float)local_1358 - fVar195;
                  fVar173 = local_1358._4_4_ - fVar197;
                  fVar175 = local_1348 - local_1358._4_4_;
                  fVar177 = fStack_1344 - (float)local_1358;
                  fStack_11cc = *(float *)(ray + k * 4);
                  local_11d8 = fVar195 - fStack_11cc;
                  fStack_11d4 = fVar197 - fStack_11cc;
                  fStack_11d0 = local_1358._4_4_ - fStack_11cc;
                  fStack_11cc = (float)local_1358 - fStack_11cc;
                  fVar194 = *(float *)(ray + k * 4 + 0x10);
                  fVar191 = fVar191 - fVar194;
                  fVar192 = local_fb8 - fVar194;
                  fVar193 = local_f98 - fVar194;
                  fVar194 = local_11a8 - fVar194;
                  fVar168 = *(float *)(ray + k * 4 + 0x40);
                  fVar174 = *(float *)(ray + k * 4 + 0x50);
                  fVar212 = local_11d8 * fVar174 - fVar191 * fVar168;
                  fVar213 = fStack_11d4 * fVar174 - fVar192 * fVar168;
                  fVar214 = fStack_11d0 * fVar174 - fVar193 * fVar168;
                  fVar215 = fStack_11cc * fVar174 - fVar194 * fVar168;
                  fVar195 = fVar195 - fVar197;
                  fVar197 = fVar197 - *pfVar4;
                  fVar198 = local_1358._4_4_ - fStack_1200;
                  fVar199 = (float)local_1358 - fStack_11fc;
                  local_1248._0_4_ = fVar195 * fVar183 - fVar204 * fVar167;
                  local_1248._4_4_ = fVar197 * fVar185 - fVar206 * fVar173;
                  fStack_1240 = fVar198 * fVar187 - fVar208 * fVar175;
                  fStack_123c = fVar199 * fVar189 - fVar210 * fVar177;
                  fStack_11bc = *(float *)(ray + k * 4 + 0x20);
                  local_11c8 = local_11c8 - fStack_11bc;
                  fStack_11c4 = fStack_11c4 - fStack_11bc;
                  fStack_11c0 = fStack_fc4 - fStack_11bc;
                  fStack_11bc = local_fc8 - fStack_11bc;
                  fVar176 = *(float *)(ray + k * 4 + 0x60);
                  fVar113 = local_11c8 * fVar168 - local_11d8 * fVar176;
                  fVar129 = fStack_11c4 * fVar168 - fStack_11d4 * fVar176;
                  fVar130 = fStack_11c0 * fVar168 - fStack_11d0 * fVar176;
                  fVar131 = fStack_11bc * fVar168 - fStack_11cc * fVar176;
                  local_1238._0_4_ = fVar155 * fVar167 - fVar195 * fVar178;
                  local_1238._4_4_ = fVar164 * fVar173 - fVar197 * fVar180;
                  fStack_1230 = fVar165 * fVar175 - fVar198 * fVar181;
                  fStack_122c = fVar166 * fVar177 - fVar199 * fVar182;
                  fVar205 = fVar191 * fVar176 - local_11c8 * fVar174;
                  fVar207 = fVar192 * fVar176 - fStack_11c4 * fVar174;
                  fVar209 = fVar193 * fVar176 - fStack_11c0 * fVar174;
                  fVar211 = fVar194 * fVar176 - fStack_11bc * fVar174;
                  fVar200 = fVar168 * local_1258[0] +
                            fVar174 * (float)local_1248._0_4_ + fVar176 * (float)local_1238._0_4_;
                  fVar201 = fVar168 * local_1258[1] +
                            fVar174 * (float)local_1248._4_4_ + fVar176 * (float)local_1238._4_4_;
                  fVar202 = fVar168 * local_1258[2] + fVar174 * fStack_1240 + fVar176 * fStack_1230;
                  fVar203 = fVar168 * local_1258[3] + fVar174 * fStack_123c + fVar176 * fStack_122c;
                  uVar184 = (uint)fVar200 & 0x80000000;
                  uVar186 = (uint)fVar201 & 0x80000000;
                  uVar188 = (uint)fVar202 & 0x80000000;
                  uVar190 = (uint)fVar203 & 0x80000000;
                  fVar168 = (float)((uint)(fVar167 * fVar205 + fVar178 * fVar113 + fVar183 * fVar212
                                          ) ^ uVar184);
                  fVar174 = (float)((uint)(fVar173 * fVar207 + fVar180 * fVar129 + fVar185 * fVar213
                                          ) ^ uVar186);
                  fVar176 = (float)((uint)(fVar175 * fVar209 + fVar181 * fVar130 + fVar187 * fVar214
                                          ) ^ uVar188);
                  fVar167 = (float)((uint)(fVar177 * fVar211 + fVar182 * fVar131 + fVar189 * fVar215
                                          ) ^ uVar190);
                  fVar113 = (float)((uint)(fVar205 * fVar195 + fVar113 * fVar155 + fVar212 * fVar204
                                          ) ^ uVar184);
                  fVar129 = (float)((uint)(fVar207 * fVar197 + fVar129 * fVar164 + fVar213 * fVar206
                                          ) ^ uVar186);
                  fVar130 = (float)((uint)(fVar209 * fVar198 + fVar130 * fVar165 + fVar214 * fVar208
                                          ) ^ uVar188);
                  fVar131 = (float)((uint)(fVar211 * fVar199 + fVar131 * fVar166 + fVar215 * fVar210
                                          ) ^ uVar190);
                  fVar195 = ABS(fVar200);
                  fVar197 = ABS(fVar201);
                  auVar179._0_8_ = CONCAT44(fVar201,fVar200) & 0x7fffffff7fffffff;
                  auVar179._8_4_ = ABS(fVar202);
                  auVar179._12_4_ = ABS(fVar203);
                  bVar19 = ((0.0 <= fVar168 && 0.0 <= fVar113) && fVar200 != 0.0) &&
                           fVar168 + fVar113 <= fVar195;
                  auVar196._0_4_ = -(uint)bVar19;
                  bVar20 = ((0.0 <= fVar174 && 0.0 <= fVar129) && fVar201 != 0.0) &&
                           fVar174 + fVar129 <= fVar197;
                  auVar196._4_4_ = -(uint)bVar20;
                  bVar18 = ((0.0 <= fVar176 && 0.0 <= fVar130) && fVar202 != 0.0) &&
                           fVar176 + fVar130 <= auVar179._8_4_;
                  auVar196._8_4_ = -(uint)bVar18;
                  bVar17 = ((0.0 <= fVar167 && 0.0 <= fVar131) && fVar203 != 0.0) &&
                           fVar167 + fVar131 <= auVar179._12_4_;
                  auVar196._12_4_ = -(uint)bVar17;
                  iVar45 = movmskps((int)lVar12,auVar196);
                  iStack_11b4 = auVar29._4_4_;
                  sx.field_0.i[1] = sx.field_0.i[0];
                  sx.field_0.i[2] = sx.field_0.i[0];
                  sx.field_0.i[3] = sx.field_0.i[0];
                  local_1098 = ZEXT416((uint)fVar154);
                  local_10a8 = ZEXT416(uVar39);
                  local_11b8 = iStack_11b4;
                  iStack_11b0 = iStack_11b4;
                  iStack_11ac = iStack_11b4;
                  if (iVar45 != 0) {
                    fVar155 = (float)(uVar184 ^
                                     (uint)(local_11d8 * local_1258[0] +
                                           fVar191 * (float)local_1248._0_4_ +
                                           local_11c8 * (float)local_1238._0_4_));
                    fVar164 = (float)(uVar186 ^
                                     (uint)(fStack_11d4 * local_1258[1] +
                                           fVar192 * (float)local_1248._4_4_ +
                                           fStack_11c4 * (float)local_1238._4_4_));
                    fVar165 = (float)(uVar188 ^
                                     (uint)(fStack_11d0 * local_1258[2] +
                                           fVar193 * fStack_1240 + fStack_11c0 * fStack_1230));
                    fVar194 = (float)(uVar190 ^
                                     (uint)(fStack_11cc * local_1258[3] +
                                           fVar194 * fStack_123c + fStack_11bc * fStack_122c));
                    fVar191 = *(float *)(ray + k * 4 + 0x30);
                    bVar19 = (fVar191 * fVar195 < fVar155 && fVar155 <= fVar216 * fVar195) && bVar19
                    ;
                    valid.field_0.i[0] = -(uint)bVar19;
                    bVar20 = (fVar191 * fVar197 < fVar164 && fVar164 <= fVar216 * fVar197) && bVar20
                    ;
                    valid.field_0.i[1] = -(uint)bVar20;
                    bVar18 = (fVar191 * auVar179._8_4_ < fVar165 &&
                             fVar165 <= fVar216 * auVar179._8_4_) && bVar18;
                    valid.field_0.i[2] = -(uint)bVar18;
                    bVar17 = (fVar191 * auVar179._12_4_ < fVar194 &&
                             fVar194 <= fVar216 * auVar179._12_4_) && bVar17;
                    valid.field_0.i[3] = -(uint)bVar17;
                    iVar45 = movmskps(iVar45,(undefined1  [16])valid.field_0);
                    if (iVar45 != 0) {
                      auVar101._4_12_ = valid.field_0._4_12_;
                      auVar101._0_4_ = (float)(int)(*(ushort *)(lVar11 + 8 + lVar51) - 1);
                      auVar150._4_4_ = valid.field_0.i[1];
                      auVar150._0_4_ = auVar101._0_4_;
                      auVar150._8_4_ = valid.field_0.i[2];
                      auVar150._12_4_ = valid.field_0.i[3];
                      auVar61 = rcpss(auVar150,auVar101);
                      fVar216 = (2.0 - auVar101._0_4_ * auVar61._0_4_) * auVar61._0_4_;
                      auVar151._4_12_ = auVar61._4_12_;
                      auVar151._0_4_ = (float)(int)(*(ushort *)(lVar11 + 10 + lVar51) - 1);
                      auVar159._4_4_ = auVar61._4_4_;
                      auVar159._0_4_ = auVar151._0_4_;
                      auVar159._8_4_ = auVar61._8_4_;
                      auVar159._12_4_ = auVar61._12_4_;
                      auVar61 = rcpss(auVar159,auVar151);
                      fVar191 = (2.0 - auVar151._0_4_ * auVar61._0_4_) * auVar61._0_4_;
                      tNear.field_0.v[0] = fVar216 * ((float)sx.field_0.i[0] * fVar195 + fVar168);
                      tNear.field_0.v[1] =
                           fVar216 * ((float)(sx.field_0.i[0] + 1) * fVar197 + fVar174);
                      tNear.field_0.v[2] =
                           fVar216 * ((float)(sx.field_0.i[0] + 1) * auVar179._8_4_ + fVar176);
                      tNear.field_0.v[3] =
                           fVar216 * ((float)sx.field_0.i[0] * auVar179._12_4_ + fVar167);
                      auVar139._0_4_ = (float)iStack_11b4 * fVar195 + fVar113;
                      auVar139._4_4_ = (float)iStack_11b4 * fVar197 + fVar129;
                      auVar139._8_4_ = (float)(iStack_11b4 + 1) * auVar179._8_4_ + fVar130;
                      auVar139._12_4_ = (float)(iStack_11b4 + 1) * auVar179._12_4_ + fVar131;
                      pGVar10 = (pSVar42->geometries).items[(uint)fVar154].ptr;
                      uVar184 = *(uint *)(ray + k * 4 + 0x90);
                      pSVar42 = (Scene *)(ulong)uVar184;
                      if ((pGVar10->mask & uVar184) != 0) {
                        auVar61 = rcpps(auVar139,auVar179);
                        fVar216 = auVar61._0_4_;
                        fVar168 = auVar61._4_4_;
                        fVar174 = auVar61._8_4_;
                        fVar176 = auVar61._12_4_;
                        fVar216 = (1.0 - fVar195 * fVar216) * fVar216 + fVar216;
                        fVar168 = (1.0 - fVar197 * fVar168) * fVar168 + fVar168;
                        fVar174 = (1.0 - auVar179._8_4_ * fVar174) * fVar174 + fVar174;
                        fVar176 = (1.0 - auVar179._12_4_ * fVar176) * fVar176 + fVar176;
                        local_1268[0] = fVar155 * fVar216;
                        local_1268[1] = fVar164 * fVar168;
                        local_1268[2] = fVar165 * fVar174;
                        local_1268[3] = fVar194 * fVar176;
                        local_1288[0] = tNear.field_0.v[0] * fVar216;
                        local_1288[1] = tNear.field_0.v[1] * fVar168;
                        local_1288[2] = tNear.field_0.v[2] * fVar174;
                        local_1288[3] = tNear.field_0.v[3] * fVar176;
                        local_1278[0] = fVar191 * auVar139._0_4_ * fVar216;
                        local_1278[1] = fVar191 * auVar139._4_4_ * fVar168;
                        local_1278[2] = fVar191 * auVar139._8_4_ * fVar174;
                        local_1278[3] = fVar191 * auVar139._12_4_ * fVar176;
                        auVar140._0_4_ = (uint)(fVar155 * fVar216) & valid.field_0.i[0];
                        auVar140._4_4_ = (uint)(fVar164 * fVar168) & valid.field_0.i[1];
                        auVar140._8_4_ = (uint)(fVar165 * fVar174) & valid.field_0.i[2];
                        auVar140._12_4_ = (uint)(fVar194 * fVar176) & valid.field_0.i[3];
                        auVar102._0_8_ =
                             CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                        auVar102._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                        auVar102._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                        auVar102 = auVar102 | auVar140;
                        auVar141._4_4_ = auVar102._0_4_;
                        auVar141._0_4_ = auVar102._4_4_;
                        auVar141._8_4_ = auVar102._12_4_;
                        auVar141._12_4_ = auVar102._8_4_;
                        auVar61 = minps(auVar141,auVar102);
                        auVar75._0_8_ = auVar61._8_8_;
                        auVar75._8_4_ = auVar61._0_4_;
                        auVar75._12_4_ = auVar61._4_4_;
                        auVar61 = minps(auVar75,auVar61);
                        auVar76._0_8_ =
                             CONCAT44(-(uint)(auVar61._4_4_ == auVar102._4_4_ && bVar20),
                                      -(uint)(auVar61._0_4_ == auVar102._0_4_ && bVar19));
                        auVar76._8_4_ = -(uint)(auVar61._8_4_ == auVar102._8_4_ && bVar18);
                        auVar76._12_4_ = -(uint)(auVar61._12_4_ == auVar102._12_4_ && bVar17);
                        iVar45 = movmskps(uVar184,auVar76);
                        aVar120 = valid.field_0;
                        if (iVar45 != 0) {
                          aVar120.i[2] = auVar76._8_4_;
                          aVar120._0_8_ = auVar76._0_8_;
                          aVar120.i[3] = auVar76._12_4_;
                        }
                        uVar184 = movmskps(iVar45,(undefined1  [16])aVar120);
                        lVar41 = 0;
                        if (uVar184 != 0) {
                          for (; (uVar184 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                          }
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar216 = local_1288[lVar41];
                          fVar195 = local_1278[lVar41];
                          fVar191 = local_1258[lVar41];
                          uVar38 = *(undefined4 *)(local_1248 + lVar41 * 4);
                          uVar5 = *(undefined4 *)(local_1238 + lVar41 * 4);
                          *(float *)(ray + k * 4 + 0x80) = local_1268[lVar41];
                          *(float *)(ray + k * 4 + 0xc0) = fVar191;
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar38;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar5;
                          *(float *)(ray + k * 4 + 0xf0) = fVar216;
                          *(float *)(ray + k * 4 + 0x100) = fVar195;
                          *(uint *)(ray + k * 4 + 0x110) = uVar39;
                          *(float *)(ray + k * 4 + 0x120) = fVar154;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          uVar184 = context->user->instPrimID[0];
                          *(uint *)(ray + k * 4 + 0x140) = uVar184;
                        }
                        else {
                          local_11d8 = fVar154;
                          fStack_11d4 = fVar154;
                          fStack_11d0 = fVar154;
                          fStack_11cc = fVar154;
                          local_fd8 = uVar39;
                          uStack_fd4 = uVar39;
                          uStack_fd0 = uVar39;
                          uStack_fcc = uVar39;
                          local_fe8 = *(undefined8 *)(mm_lookupmask_ps + lVar40);
                          uStack_fe0 = *(undefined8 *)(mm_lookupmask_ps + lVar40 + 8);
                          do {
                            local_11c8 = *(float *)(ray + k * 4 + 0x80);
                            local_1048 = local_1288[lVar41];
                            local_1038 = local_1278[lVar41];
                            *(float *)(ray + k * 4 + 0x80) = local_1268[lVar41];
                            args.context = context->user;
                            local_1078 = local_1258[lVar41];
                            local_1068._4_4_ = *(undefined4 *)(local_1248 + lVar41 * 4);
                            local_1058._4_4_ = *(undefined4 *)(local_1238 + lVar41 * 4);
                            fStack_1074 = local_1078;
                            fStack_1070 = local_1078;
                            fStack_106c = local_1078;
                            local_1068._0_4_ = local_1068._4_4_;
                            local_1068._8_4_ = local_1068._4_4_;
                            local_1068._12_4_ = local_1068._4_4_;
                            local_1058._0_4_ = local_1058._4_4_;
                            local_1058._8_4_ = local_1058._4_4_;
                            local_1058._12_4_ = local_1058._4_4_;
                            fStack_1044 = local_1048;
                            fStack_1040 = local_1048;
                            fStack_103c = local_1048;
                            fStack_1034 = local_1038;
                            fStack_1030 = local_1038;
                            fStack_102c = local_1038;
                            local_1028 = CONCAT44(uStack_fd4,local_fd8);
                            uStack_1020 = CONCAT44(uStack_fcc,uStack_fd0);
                            local_1018 = CONCAT44(fStack_11d4,local_11d8);
                            uStack_1010 = CONCAT44(fStack_11cc,fStack_11d0);
                            local_1008 = (args.context)->instID[0];
                            uStack_1004 = local_1008;
                            uStack_1000 = local_1008;
                            uStack_ffc = local_1008;
                            local_ff8 = (args.context)->instPrimID[0];
                            uStack_ff4 = local_ff8;
                            uStack_ff0 = local_ff8;
                            uStack_fec = local_ff8;
                            local_1368 = local_fe8;
                            uStack_1360 = uStack_fe0;
                            args.valid = (int *)&local_1368;
                            pRVar47 = (RTCIntersectArguments *)pGVar10->userPtr;
                            args.hit = (RTCHitN *)&local_1078;
                            args.N = 4;
                            p_Var44 = pGVar10->intersectionFilterN;
                            local_1218._0_8_ = lVar41;
                            args.geometryUserPtr = pRVar47;
                            args.ray = (RTCRayN *)ray;
                            if (p_Var44 != (RTCFilterFunctionN)0x0) {
                              p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                              lVar41 = local_1218._0_8_;
                            }
                            auVar79._0_4_ = -(uint)((int)local_1368 == 0);
                            auVar79._4_4_ = -(uint)(local_1368._4_4_ == 0);
                            auVar79._8_4_ = -(uint)((int)uStack_1360 == 0);
                            auVar79._12_4_ = -(uint)(uStack_1360._4_4_ == 0);
                            uVar184 = movmskps((int)p_Var44,auVar79);
                            pRVar43 = (RTCRayN *)(ulong)(uVar184 ^ 0xf);
                            if ((uVar184 ^ 0xf) == 0) {
                              auVar79 = auVar79 ^ _DAT_01febe20;
                            }
                            else {
                              pRVar47 = context->args;
                              p_Var44 = pRVar47->filter;
                              if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                                 (((pRVar47->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                                lVar41 = local_1218._0_8_;
                              }
                              auVar105._0_4_ = -(uint)((int)local_1368 == 0);
                              auVar105._4_4_ = -(uint)(local_1368._4_4_ == 0);
                              auVar105._8_4_ = -(uint)((int)uStack_1360 == 0);
                              auVar105._12_4_ = -(uint)(uStack_1360._4_4_ == 0);
                              auVar79 = auVar105 ^ _DAT_01febe20;
                              uVar184 = movmskps((int)p_Var44,auVar105);
                              pRVar43 = (RTCRayN *)(ulong)(uVar184 ^ 0xf);
                              if ((uVar184 ^ 0xf) != 0) {
                                uVar184 = *(uint *)(args.hit + 4);
                                uVar186 = *(uint *)(args.hit + 8);
                                uVar188 = *(uint *)(args.hit + 0xc);
                                *(uint *)(args.ray + 0xc0) =
                                     ~auVar105._0_4_ & *(uint *)args.hit |
                                     *(uint *)(args.ray + 0xc0) & auVar105._0_4_;
                                *(uint *)(args.ray + 0xc4) =
                                     ~auVar105._4_4_ & uVar184 |
                                     *(uint *)(args.ray + 0xc4) & auVar105._4_4_;
                                *(uint *)(args.ray + 200) =
                                     ~auVar105._8_4_ & uVar186 |
                                     *(uint *)(args.ray + 200) & auVar105._8_4_;
                                *(uint *)(args.ray + 0xcc) =
                                     ~auVar105._12_4_ & uVar188 |
                                     *(uint *)(args.ray + 0xcc) & auVar105._12_4_;
                                uVar184 = *(uint *)(args.hit + 0x14);
                                uVar186 = *(uint *)(args.hit + 0x18);
                                uVar188 = *(uint *)(args.hit + 0x1c);
                                *(uint *)(args.ray + 0xd0) =
                                     ~auVar105._0_4_ & *(uint *)(args.hit + 0x10) |
                                     *(uint *)(args.ray + 0xd0) & auVar105._0_4_;
                                *(uint *)(args.ray + 0xd4) =
                                     ~auVar105._4_4_ & uVar184 |
                                     *(uint *)(args.ray + 0xd4) & auVar105._4_4_;
                                *(uint *)(args.ray + 0xd8) =
                                     ~auVar105._8_4_ & uVar186 |
                                     *(uint *)(args.ray + 0xd8) & auVar105._8_4_;
                                *(uint *)(args.ray + 0xdc) =
                                     ~auVar105._12_4_ & uVar188 |
                                     *(uint *)(args.ray + 0xdc) & auVar105._12_4_;
                                uVar184 = *(uint *)(args.hit + 0x24);
                                uVar186 = *(uint *)(args.hit + 0x28);
                                uVar188 = *(uint *)(args.hit + 0x2c);
                                *(uint *)(args.ray + 0xe0) =
                                     ~auVar105._0_4_ & *(uint *)(args.hit + 0x20) |
                                     *(uint *)(args.ray + 0xe0) & auVar105._0_4_;
                                *(uint *)(args.ray + 0xe4) =
                                     ~auVar105._4_4_ & uVar184 |
                                     *(uint *)(args.ray + 0xe4) & auVar105._4_4_;
                                *(uint *)(args.ray + 0xe8) =
                                     ~auVar105._8_4_ & uVar186 |
                                     *(uint *)(args.ray + 0xe8) & auVar105._8_4_;
                                *(uint *)(args.ray + 0xec) =
                                     ~auVar105._12_4_ & uVar188 |
                                     *(uint *)(args.ray + 0xec) & auVar105._12_4_;
                                auVar162._0_4_ = *(uint *)(args.ray + 0xf0) & auVar105._0_4_;
                                auVar162._4_4_ = *(uint *)(args.ray + 0xf4) & auVar105._4_4_;
                                auVar162._8_4_ = *(uint *)(args.ray + 0xf8) & auVar105._8_4_;
                                auVar162._12_4_ = *(uint *)(args.ray + 0xfc) & auVar105._12_4_;
                                auVar122._0_4_ = ~auVar105._0_4_ & *(uint *)(args.hit + 0x30);
                                auVar122._4_4_ = ~auVar105._4_4_ & *(uint *)(args.hit + 0x34);
                                auVar122._8_4_ = ~auVar105._8_4_ & *(uint *)(args.hit + 0x38);
                                auVar122._12_4_ = ~auVar105._12_4_ & *(uint *)(args.hit + 0x3c);
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar122 | auVar162;
                                uVar184 = *(uint *)(args.hit + 0x44);
                                uVar186 = *(uint *)(args.hit + 0x48);
                                uVar188 = *(uint *)(args.hit + 0x4c);
                                *(uint *)(args.ray + 0x100) =
                                     ~auVar105._0_4_ & *(uint *)(args.hit + 0x40) |
                                     *(uint *)(args.ray + 0x100) & auVar105._0_4_;
                                *(uint *)(args.ray + 0x104) =
                                     ~auVar105._4_4_ & uVar184 |
                                     *(uint *)(args.ray + 0x104) & auVar105._4_4_;
                                *(uint *)(args.ray + 0x108) =
                                     ~auVar105._8_4_ & uVar186 |
                                     *(uint *)(args.ray + 0x108) & auVar105._8_4_;
                                *(uint *)(args.ray + 0x10c) =
                                     ~auVar105._12_4_ & uVar188 |
                                     *(uint *)(args.ray + 0x10c) & auVar105._12_4_;
                                uVar184 = *(uint *)(args.hit + 0x54);
                                uVar186 = *(uint *)(args.hit + 0x58);
                                uVar188 = *(uint *)(args.hit + 0x5c);
                                *(uint *)(args.ray + 0x110) =
                                     *(uint *)(args.ray + 0x110) & auVar105._0_4_ |
                                     ~auVar105._0_4_ & *(uint *)(args.hit + 0x50);
                                *(uint *)(args.ray + 0x114) =
                                     *(uint *)(args.ray + 0x114) & auVar105._4_4_ |
                                     ~auVar105._4_4_ & uVar184;
                                *(uint *)(args.ray + 0x118) =
                                     *(uint *)(args.ray + 0x118) & auVar105._8_4_ |
                                     ~auVar105._8_4_ & uVar186;
                                *(uint *)(args.ray + 0x11c) =
                                     *(uint *)(args.ray + 0x11c) & auVar105._12_4_ |
                                     ~auVar105._12_4_ & uVar188;
                                uVar184 = *(uint *)(args.hit + 100);
                                uVar186 = *(uint *)(args.hit + 0x68);
                                uVar188 = *(uint *)(args.hit + 0x6c);
                                *(uint *)(args.ray + 0x120) =
                                     *(uint *)(args.ray + 0x120) & auVar105._0_4_ |
                                     ~auVar105._0_4_ & *(uint *)(args.hit + 0x60);
                                *(uint *)(args.ray + 0x124) =
                                     *(uint *)(args.ray + 0x124) & auVar105._4_4_ |
                                     ~auVar105._4_4_ & uVar184;
                                *(uint *)(args.ray + 0x128) =
                                     *(uint *)(args.ray + 0x128) & auVar105._8_4_ |
                                     ~auVar105._8_4_ & uVar186;
                                *(uint *)(args.ray + 300) =
                                     *(uint *)(args.ray + 300) & auVar105._12_4_ |
                                     ~auVar105._12_4_ & uVar188;
                                uVar184 = *(uint *)(args.hit + 0x74);
                                uVar186 = *(uint *)(args.hit + 0x78);
                                uVar188 = *(uint *)(args.hit + 0x7c);
                                *(uint *)(args.ray + 0x130) =
                                     ~auVar105._0_4_ & *(uint *)(args.hit + 0x70) |
                                     *(uint *)(args.ray + 0x130) & auVar105._0_4_;
                                *(uint *)(args.ray + 0x134) =
                                     ~auVar105._4_4_ & uVar184 |
                                     *(uint *)(args.ray + 0x134) & auVar105._4_4_;
                                *(uint *)(args.ray + 0x138) =
                                     ~auVar105._8_4_ & uVar186 |
                                     *(uint *)(args.ray + 0x138) & auVar105._8_4_;
                                *(uint *)(args.ray + 0x13c) =
                                     ~auVar105._12_4_ & uVar188 |
                                     *(uint *)(args.ray + 0x13c) & auVar105._12_4_;
                                uVar184 = *(uint *)(args.hit + 0x84);
                                uVar186 = *(uint *)(args.hit + 0x88);
                                uVar188 = *(uint *)(args.hit + 0x8c);
                                *(uint *)(args.ray + 0x140) =
                                     ~auVar105._0_4_ & *(uint *)(args.hit + 0x80) |
                                     *(uint *)(args.ray + 0x140) & auVar105._0_4_;
                                *(uint *)(args.ray + 0x144) =
                                     ~auVar105._4_4_ & uVar184 |
                                     *(uint *)(args.ray + 0x144) & auVar105._4_4_;
                                *(uint *)(args.ray + 0x148) =
                                     ~auVar105._8_4_ & uVar186 |
                                     *(uint *)(args.ray + 0x148) & auVar105._8_4_;
                                *(uint *)(args.ray + 0x14c) =
                                     ~auVar105._12_4_ & uVar188 |
                                     *(uint *)(args.ray + 0x14c) & auVar105._12_4_;
                                pRVar43 = args.ray;
                                pRVar47 = (RTCIntersectArguments *)args.hit;
                              }
                            }
                            auVar80._0_4_ = auVar79._0_4_ << 0x1f;
                            auVar80._4_4_ = auVar79._4_4_ << 0x1f;
                            auVar80._8_4_ = auVar79._8_4_ << 0x1f;
                            auVar80._12_4_ = auVar79._12_4_ << 0x1f;
                            iVar45 = movmskps((int)pRVar43,auVar80);
                            if (iVar45 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = local_11c8;
                            }
                            valid.field_0.v[lVar41] = 0.0;
                            fVar216 = *(float *)(ray + k * 4 + 0x80);
                            valid.field_0.i[0] =
                                 -(uint)(local_1268[0] <= fVar216) & valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(local_1268[1] <= fVar216) & valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(local_1268[2] <= fVar216) & valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(local_1268[3] <= fVar216) & valid.field_0.i[3];
                            uVar184 = movmskps(iVar45,(undefined1  [16])valid.field_0);
                            if (uVar184 != 0) {
                              auVar106._0_4_ = (uint)local_1268[0] & valid.field_0.i[0];
                              auVar106._4_4_ = (uint)local_1268[1] & valid.field_0.i[1];
                              auVar106._8_4_ = (uint)local_1268[2] & valid.field_0.i[2];
                              auVar106._12_4_ = (uint)local_1268[3] & valid.field_0.i[3];
                              auVar123._0_8_ =
                                   CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                   0x7f8000007f800000;
                              auVar123._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                              auVar123._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                              auVar123 = auVar123 | auVar106;
                              auVar144._4_4_ = auVar123._0_4_;
                              auVar144._0_4_ = auVar123._4_4_;
                              auVar144._8_4_ = auVar123._12_4_;
                              auVar144._12_4_ = auVar123._8_4_;
                              auVar61 = minps(auVar144,auVar123);
                              auVar107._0_8_ = auVar61._8_8_;
                              auVar107._8_4_ = auVar61._0_4_;
                              auVar107._12_4_ = auVar61._4_4_;
                              auVar61 = minps(auVar107,auVar61);
                              auVar108._0_8_ =
                                   CONCAT44(-(uint)(auVar61._4_4_ == auVar123._4_4_) &
                                            valid.field_0.i[1],
                                            -(uint)(auVar61._0_4_ == auVar123._0_4_) &
                                            valid.field_0.i[0]);
                              auVar108._8_4_ =
                                   -(uint)(auVar61._8_4_ == auVar123._8_4_) & valid.field_0.i[2];
                              auVar108._12_4_ =
                                   -(uint)(auVar61._12_4_ == auVar123._12_4_) & valid.field_0.i[3];
                              iVar45 = movmskps((int)pRVar47,auVar108);
                              aVar81 = valid.field_0;
                              if (iVar45 != 0) {
                                aVar81.i[2] = auVar108._8_4_;
                                aVar81._0_8_ = auVar108._0_8_;
                                aVar81.i[3] = auVar108._12_4_;
                              }
                              uVar38 = movmskps(iVar45,(undefined1  [16])aVar81);
                              uVar48 = CONCAT44((int)((ulong)pRVar47 >> 0x20),uVar38);
                              lVar41 = 0;
                              if (uVar48 != 0) {
                                for (; (uVar48 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                                }
                              }
                            }
                          } while ((char)uVar184 != '\0');
                        }
                        pSVar42 = (Scene *)(ulong)uVar184;
                      }
                    }
                  }
                  local_1358._0_4_ = (float)local_fa8 - (float)local_1358;
                  local_1358._4_4_ = local_fa8._4_4_ - local_1358._4_4_;
                  fStack_1350 = fStack_fa0 - fStack_1350;
                  fStack_134c = fStack_f9c - fStack_134c;
                  local_11a8 = local_f98 - local_11a8;
                  fStack_11a4 = fStack_f94 - fStack_11a4;
                  fStack_11a0 = fStack_f90 - fStack_11a0;
                  fStack_119c = fStack_f8c - fStack_119c;
                  fVar167 = local_1348 - local_fc8;
                  fVar173 = fStack_1344 - fStack_fc4;
                  fVar175 = fStack_1340 - fStack_fc0;
                  fVar177 = fStack_133c - fStack_fbc;
                  local_1208._0_4_ = (float)local_1208 - (float)local_fa8;
                  local_1208._4_4_ = local_1208._4_4_ - local_fa8._4_4_;
                  fVar174 = fStack_1200 - fStack_fa0;
                  fVar176 = fStack_11fc - fStack_f9c;
                  fVar113 = local_fb8 - local_f98;
                  fVar129 = fStack_fb4 - fStack_f94;
                  fVar130 = fStack_fb0 - fStack_f90;
                  fVar131 = fStack_fac - fStack_f8c;
                  local_1198._0_4_ = (float)local_1198 - local_1348;
                  local_1198._4_4_ = local_1198._4_4_ - fStack_1344;
                  fVar200 = (float)uStack_1190 - fStack_1340;
                  fVar201 = uStack_1190._4_4_ - fStack_133c;
                  local_1258[0] = fVar113 * fVar167 - (float)local_1198 * local_11a8;
                  local_1258[1] = fVar129 * fVar173 - local_1198._4_4_ * fStack_11a4;
                  local_1258[2] = fVar130 * fVar175 - fVar200 * fStack_11a0;
                  local_1258[3] = fVar131 * fVar177 - fVar201 * fStack_119c;
                  local_1248._0_4_ =
                       (float)local_1198 * (float)local_1358 - (float)local_1208 * fVar167;
                  local_1248._4_4_ =
                       local_1198._4_4_ * local_1358._4_4_ - local_1208._4_4_ * fVar173;
                  fStack_1240 = fVar200 * fStack_1350 - fVar174 * fVar175;
                  fStack_123c = fVar201 * fStack_134c - fVar176 * fVar177;
                  local_1238._0_4_ = (float)local_1208 * local_11a8 - fVar113 * (float)local_1358;
                  local_1238._4_4_ = local_1208._4_4_ * fStack_11a4 - fVar129 * local_1358._4_4_;
                  fStack_1230 = fVar174 * fStack_11a0 - fVar130 * fStack_1350;
                  fStack_122c = fVar176 * fStack_119c - fVar131 * fStack_134c;
                  fVar216 = *(float *)(ray + k * 4);
                  fVar195 = *(float *)(ray + k * 4 + 0x10);
                  fVar191 = *(float *)(ray + k * 4 + 0x20);
                  fVar197 = *(float *)(ray + k * 4 + 0x40);
                  fVar194 = *(float *)(ray + k * 4 + 0x50);
                  fVar168 = *(float *)(ray + k * 4 + 0x60);
                  fVar205 = (float)local_fa8 - fVar216;
                  fVar206 = local_fa8._4_4_ - fVar216;
                  fVar207 = fStack_fa0 - fVar216;
                  fVar216 = fStack_f9c - fVar216;
                  fVar202 = local_f98 - fVar195;
                  fVar203 = fStack_f94 - fVar195;
                  fVar204 = fStack_f90 - fVar195;
                  fVar195 = fStack_f8c - fVar195;
                  local_1348 = local_1348 - fVar191;
                  fStack_1344 = fStack_1344 - fVar191;
                  fStack_1340 = fStack_1340 - fVar191;
                  fStack_133c = fStack_133c - fVar191;
                  fVar155 = fVar202 * fVar168 - local_1348 * fVar194;
                  fVar164 = fVar203 * fVar168 - fStack_1344 * fVar194;
                  fVar165 = fVar204 * fVar168 - fStack_1340 * fVar194;
                  fVar166 = fVar195 * fVar168 - fStack_133c * fVar194;
                  fVar183 = local_1348 * fVar197 - fVar205 * fVar168;
                  fVar185 = fStack_1344 * fVar197 - fVar206 * fVar168;
                  fVar187 = fStack_1340 * fVar197 - fVar207 * fVar168;
                  fVar189 = fStack_133c * fVar197 - fVar216 * fVar168;
                  fVar192 = fVar205 * fVar194 - fVar202 * fVar197;
                  fVar193 = fVar206 * fVar194 - fVar203 * fVar197;
                  fVar198 = fVar207 * fVar194 - fVar204 * fVar197;
                  fVar199 = fVar216 * fVar194 - fVar195 * fVar197;
                  fVar178 = fVar197 * local_1258[0] +
                            fVar194 * (float)local_1248._0_4_ + fVar168 * (float)local_1238._0_4_;
                  fVar180 = fVar197 * local_1258[1] +
                            fVar194 * (float)local_1248._4_4_ + fVar168 * (float)local_1238._4_4_;
                  fVar181 = fVar197 * local_1258[2] + fVar194 * fStack_1240 + fVar168 * fStack_1230;
                  fVar182 = fVar197 * local_1258[3] + fVar194 * fStack_123c + fVar168 * fStack_122c;
                  uVar184 = (uint)fVar178 & 0x80000000;
                  uVar186 = (uint)fVar180 & 0x80000000;
                  uVar188 = (uint)fVar181 & 0x80000000;
                  uVar190 = (uint)fVar182 & 0x80000000;
                  fVar191 = (float)((uint)((float)local_1208 * fVar155 +
                                          fVar113 * fVar183 + (float)local_1198 * fVar192) ^ uVar184
                                   );
                  fVar197 = (float)((uint)(local_1208._4_4_ * fVar164 +
                                          fVar129 * fVar185 + local_1198._4_4_ * fVar193) ^ uVar186)
                  ;
                  fVar194 = (float)((uint)(fVar174 * fVar165 + fVar130 * fVar187 + fVar200 * fVar198
                                          ) ^ uVar188);
                  fVar168 = (float)((uint)(fVar176 * fVar166 + fVar131 * fVar189 + fVar201 * fVar199
                                          ) ^ uVar190);
                  fVar113 = (float)((uint)(fVar155 * (float)local_1358 +
                                          fVar183 * local_11a8 + fVar192 * fVar167) ^ uVar184);
                  fVar129 = (float)((uint)(fVar164 * local_1358._4_4_ +
                                          fVar185 * fStack_11a4 + fVar193 * fVar173) ^ uVar186);
                  fVar130 = (float)((uint)(fVar165 * fStack_1350 +
                                          fVar187 * fStack_11a0 + fVar198 * fVar175) ^ uVar188);
                  fVar131 = (float)((uint)(fVar166 * fStack_134c +
                                          fVar189 * fStack_119c + fVar199 * fVar177) ^ uVar190);
                  fVar174 = ABS(fVar178);
                  fVar176 = ABS(fVar180);
                  auVar138._0_8_ = CONCAT44(fVar180,fVar178) & 0x7fffffff7fffffff;
                  auVar138._8_4_ = ABS(fVar181);
                  auVar138._12_4_ = ABS(fVar182);
                  bVar19 = ((0.0 <= fVar191 && 0.0 <= fVar113) && fVar178 != 0.0) &&
                           fVar191 + fVar113 <= fVar174;
                  auVar170._0_4_ = -(uint)bVar19;
                  bVar20 = ((0.0 <= fVar197 && 0.0 <= fVar129) && fVar180 != 0.0) &&
                           fVar197 + fVar129 <= fVar176;
                  auVar170._4_4_ = -(uint)bVar20;
                  bVar18 = ((0.0 <= fVar194 && 0.0 <= fVar130) && fVar181 != 0.0) &&
                           fVar194 + fVar130 <= auVar138._8_4_;
                  auVar170._8_4_ = -(uint)bVar18;
                  bVar17 = ((0.0 <= fVar168 && 0.0 <= fVar131) && fVar182 != 0.0) &&
                           fVar168 + fVar131 <= auVar138._12_4_;
                  auVar170._12_4_ = -(uint)bVar17;
                  iVar45 = movmskps((int)pSVar42,auVar170);
                  if (iVar45 != 0) {
                    fVar155 = (float)(uVar184 ^
                                     (uint)(fVar205 * local_1258[0] +
                                           fVar202 * (float)local_1248._0_4_ +
                                           local_1348 * (float)local_1238._0_4_));
                    fVar164 = (float)(uVar186 ^
                                     (uint)(fVar206 * local_1258[1] +
                                           fVar203 * (float)local_1248._4_4_ +
                                           fStack_1344 * (float)local_1238._4_4_));
                    fVar165 = (float)(uVar188 ^
                                     (uint)(fVar207 * local_1258[2] +
                                           fVar204 * fStack_1240 + fStack_1340 * fStack_1230));
                    fVar166 = (float)(uVar190 ^
                                     (uint)(fVar216 * local_1258[3] +
                                           fVar195 * fStack_123c + fStack_133c * fStack_122c));
                    fVar216 = *(float *)(ray + k * 4 + 0x30);
                    fVar195 = *(float *)(ray + k * 4 + 0x80);
                    bVar19 = (fVar155 <= fVar195 * fVar174 && fVar216 * fVar174 < fVar155) && bVar19
                    ;
                    valid.field_0.i[0] = -(uint)bVar19;
                    bVar20 = (fVar164 <= fVar195 * fVar176 && fVar216 * fVar176 < fVar164) && bVar20
                    ;
                    valid.field_0.i[1] = -(uint)bVar20;
                    bVar18 = (fVar165 <= fVar195 * auVar138._8_4_ &&
                             fVar216 * auVar138._8_4_ < fVar165) && bVar18;
                    valid.field_0.i[2] = -(uint)bVar18;
                    bVar17 = (fVar166 <= fVar195 * auVar138._12_4_ &&
                             fVar216 * auVar138._12_4_ < fVar166) && bVar17;
                    valid.field_0.i[3] = -(uint)bVar17;
                    iVar45 = movmskps(iVar45,(undefined1  [16])valid.field_0);
                    if (iVar45 != 0) {
                      auVar103._4_12_ = local_1248._4_12_;
                      auVar103._0_4_ = (float)(int)(*(ushort *)(lVar11 + 8 + lVar51) - 1);
                      auVar160._4_4_ = local_1248._4_4_;
                      auVar160._0_4_ = auVar103._0_4_;
                      auVar160._8_4_ = fStack_1240;
                      auVar160._12_4_ = fStack_123c;
                      auVar61 = rcpss(auVar160,auVar103);
                      fVar216 = (2.0 - auVar103._0_4_ * auVar61._0_4_) * auVar61._0_4_;
                      auVar161._4_12_ = auVar61._4_12_;
                      auVar161._0_4_ = (float)(int)(*(ushort *)(lVar11 + 10 + lVar51) - 1);
                      auVar171._4_4_ = auVar61._4_4_;
                      auVar171._0_4_ = auVar161._0_4_;
                      auVar171._8_4_ = auVar61._8_4_;
                      auVar171._12_4_ = auVar61._12_4_;
                      auVar61 = rcpss(auVar171,auVar161);
                      fVar195 = (2.0 - auVar161._0_4_ * auVar61._0_4_) * auVar61._0_4_;
                      tNear.field_0.v[0] =
                           fVar216 * ((float)sx.field_0.i[0] * fVar174 + (fVar174 - fVar191));
                      tNear.field_0.v[1] =
                           fVar216 * ((float)(sx.field_0.i[1] + 1) * fVar176 + (fVar176 - fVar197));
                      tNear.field_0.v[2] =
                           fVar216 * ((float)(sx.field_0.i[2] + 1) * auVar138._8_4_ +
                                     (auVar138._8_4_ - fVar194));
                      tNear.field_0.v[3] =
                           fVar216 * ((float)sx.field_0.i[3] * auVar138._12_4_ +
                                     (auVar138._12_4_ - fVar168));
                      auVar152._0_4_ = (float)local_11b8 * fVar174 + (fVar174 - fVar113);
                      auVar152._4_4_ = (float)iStack_11b4 * fVar176 + (fVar176 - fVar129);
                      auVar152._8_4_ =
                           (float)(iStack_11b0 + 1) * auVar138._8_4_ + (auVar138._8_4_ - fVar130);
                      auVar152._12_4_ =
                           (float)(iStack_11ac + 1) * auVar138._12_4_ + (auVar138._12_4_ - fVar131);
                      pGVar10 = (context->scene->geometries).items[(uint)fVar154].ptr;
                      if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar61 = rcpps(auVar152,auVar138);
                        fVar216 = auVar61._0_4_;
                        fVar191 = auVar61._4_4_;
                        fVar197 = auVar61._8_4_;
                        fVar194 = auVar61._12_4_;
                        fVar216 = (1.0 - fVar174 * fVar216) * fVar216 + fVar216;
                        fVar191 = (1.0 - fVar176 * fVar191) * fVar191 + fVar191;
                        fVar197 = (1.0 - auVar138._8_4_ * fVar197) * fVar197 + fVar197;
                        fVar194 = (1.0 - auVar138._12_4_ * fVar194) * fVar194 + fVar194;
                        local_1268[0] = fVar155 * fVar216;
                        local_1268[1] = fVar164 * fVar191;
                        local_1268[2] = fVar165 * fVar197;
                        local_1268[3] = fVar166 * fVar194;
                        local_1288[0] = tNear.field_0.v[0] * fVar216;
                        local_1288[1] = tNear.field_0.v[1] * fVar191;
                        local_1288[2] = tNear.field_0.v[2] * fVar197;
                        local_1288[3] = tNear.field_0.v[3] * fVar194;
                        local_1278[0] = fVar195 * auVar152._0_4_ * fVar216;
                        local_1278[1] = fVar195 * auVar152._4_4_ * fVar191;
                        local_1278[2] = fVar195 * auVar152._8_4_ * fVar197;
                        local_1278[3] = fVar195 * auVar152._12_4_ * fVar194;
                        auVar142._0_4_ = (uint)(fVar155 * fVar216) & valid.field_0.i[0];
                        auVar142._4_4_ = (uint)(fVar164 * fVar191) & valid.field_0.i[1];
                        auVar142._8_4_ = (uint)(fVar165 * fVar197) & valid.field_0.i[2];
                        auVar142._12_4_ = (uint)(fVar166 * fVar194) & valid.field_0.i[3];
                        auVar104._0_8_ =
                             CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                        auVar104._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                        auVar104._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                        auVar104 = auVar104 | auVar142;
                        auVar143._4_4_ = auVar104._0_4_;
                        auVar143._0_4_ = auVar104._4_4_;
                        auVar143._8_4_ = auVar104._12_4_;
                        auVar143._12_4_ = auVar104._8_4_;
                        auVar61 = minps(auVar143,auVar104);
                        auVar77._0_8_ = auVar61._8_8_;
                        auVar77._8_4_ = auVar61._0_4_;
                        auVar77._12_4_ = auVar61._4_4_;
                        auVar61 = minps(auVar77,auVar61);
                        auVar78._0_8_ =
                             CONCAT44(-(uint)(auVar61._4_4_ == auVar104._4_4_ && bVar20),
                                      -(uint)(auVar61._0_4_ == auVar104._0_4_ && bVar19));
                        auVar78._8_4_ = -(uint)(auVar61._8_4_ == auVar104._8_4_ && bVar18);
                        auVar78._12_4_ = -(uint)(auVar61._12_4_ == auVar104._12_4_ && bVar17);
                        iVar45 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar78);
                        aVar121 = valid.field_0;
                        if (iVar45 != 0) {
                          aVar121.i[2] = auVar78._8_4_;
                          aVar121._0_8_ = auVar78._0_8_;
                          aVar121.i[3] = auVar78._12_4_;
                        }
                        uVar184 = movmskps(iVar45,(undefined1  [16])aVar121);
                        lVar41 = 0;
                        if (uVar184 != 0) {
                          for (; (uVar184 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                          }
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar216 = local_1288[lVar41];
                          fVar195 = local_1278[lVar41];
                          fVar191 = local_1258[lVar41];
                          uVar38 = *(undefined4 *)(local_1248 + lVar41 * 4);
                          uVar5 = *(undefined4 *)(local_1238 + lVar41 * 4);
                          *(float *)(ray + k * 4 + 0x80) = local_1268[lVar41];
                          *(float *)(ray + k * 4 + 0xc0) = fVar191;
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar38;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar5;
                          *(float *)(ray + k * 4 + 0xf0) = fVar216;
                          *(float *)(ray + k * 4 + 0x100) = fVar195;
                          *(uint *)(ray + k * 4 + 0x110) = uVar39;
                          *(float *)(ray + k * 4 + 0x120) = fVar154;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_1208 = CONCAT44(local_1098._0_4_,local_1098._0_4_);
                          fStack_1200 = (float)local_1098._0_4_;
                          fStack_11fc = (float)local_1098._0_4_;
                          local_1358 = CONCAT44(local_10a8._0_4_,local_10a8._0_4_);
                          fStack_1350 = (float)local_10a8._0_4_;
                          fStack_134c = (float)local_10a8._0_4_;
                          local_1198 = *(undefined8 *)(mm_lookupmask_ps + lVar40);
                          uStack_1190 = *(undefined8 *)(mm_lookupmask_ps + lVar40 + 8);
                          do {
                            local_1348 = *(float *)(ray + k * 4 + 0x80);
                            local_1048 = local_1288[lVar41];
                            local_1038 = local_1278[lVar41];
                            *(float *)(ray + k * 4 + 0x80) = local_1268[lVar41];
                            args.context = context->user;
                            local_1078 = local_1258[lVar41];
                            uVar38 = *(undefined4 *)(local_1248 + lVar41 * 4);
                            uVar5 = *(undefined4 *)(local_1238 + lVar41 * 4);
                            local_1068._4_4_ = uVar38;
                            local_1068._0_4_ = uVar38;
                            local_1068._8_4_ = uVar38;
                            local_1068._12_4_ = uVar38;
                            local_1058._4_4_ = uVar5;
                            local_1058._0_4_ = uVar5;
                            local_1058._8_4_ = uVar5;
                            local_1058._12_4_ = uVar5;
                            fStack_1074 = local_1078;
                            fStack_1070 = local_1078;
                            fStack_106c = local_1078;
                            fStack_1044 = local_1048;
                            fStack_1040 = local_1048;
                            fStack_103c = local_1048;
                            fStack_1034 = local_1038;
                            fStack_1030 = local_1038;
                            fStack_102c = local_1038;
                            local_1028 = local_1358;
                            uStack_1020 = CONCAT44(fStack_134c,fStack_1350);
                            local_1018 = local_1208;
                            uStack_1010 = CONCAT44(fStack_11fc,fStack_1200);
                            local_1008 = (args.context)->instID[0];
                            uStack_1004 = local_1008;
                            uStack_1000 = local_1008;
                            uStack_ffc = local_1008;
                            local_ff8 = (args.context)->instPrimID[0];
                            uStack_ff4 = local_ff8;
                            uStack_ff0 = local_ff8;
                            uStack_fec = local_ff8;
                            local_1368 = local_1198;
                            uStack_1360 = uStack_1190;
                            args.valid = (int *)&local_1368;
                            pRVar47 = (RTCIntersectArguments *)pGVar10->userPtr;
                            args.hit = (RTCHitN *)&local_1078;
                            args.N = 4;
                            p_Var44 = pGVar10->intersectionFilterN;
                            args.geometryUserPtr = pRVar47;
                            args.ray = (RTCRayN *)ray;
                            if (p_Var44 != (RTCFilterFunctionN)0x0) {
                              p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                            }
                            auVar82._0_4_ = -(uint)((int)local_1368 == 0);
                            auVar82._4_4_ = -(uint)(local_1368._4_4_ == 0);
                            auVar82._8_4_ = -(uint)((int)uStack_1360 == 0);
                            auVar82._12_4_ = -(uint)(uStack_1360._4_4_ == 0);
                            uVar39 = movmskps((int)p_Var44,auVar82);
                            pRVar43 = (RTCRayN *)(ulong)(uVar39 ^ 0xf);
                            if ((uVar39 ^ 0xf) == 0) {
                              auVar82 = auVar82 ^ _DAT_01febe20;
                            }
                            else {
                              pRVar47 = context->args;
                              p_Var44 = pRVar47->filter;
                              if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                                 (((pRVar47->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                              }
                              auVar109._0_4_ = -(uint)((int)local_1368 == 0);
                              auVar109._4_4_ = -(uint)(local_1368._4_4_ == 0);
                              auVar109._8_4_ = -(uint)((int)uStack_1360 == 0);
                              auVar109._12_4_ = -(uint)(uStack_1360._4_4_ == 0);
                              auVar82 = auVar109 ^ _DAT_01febe20;
                              uVar39 = movmskps((int)p_Var44,auVar109);
                              pRVar43 = (RTCRayN *)(ulong)(uVar39 ^ 0xf);
                              if ((uVar39 ^ 0xf) != 0) {
                                auVar124._0_4_ = *(uint *)(args.ray + 0xc0) & auVar109._0_4_;
                                auVar124._4_4_ = *(uint *)(args.ray + 0xc4) & auVar109._4_4_;
                                auVar124._8_4_ = *(uint *)(args.ray + 200) & auVar109._8_4_;
                                auVar124._12_4_ = *(uint *)(args.ray + 0xcc) & auVar109._12_4_;
                                auVar172._0_4_ = ~auVar109._0_4_ & *(uint *)args.hit;
                                auVar172._4_4_ = ~auVar109._4_4_ & *(uint *)(args.hit + 4);
                                auVar172._8_4_ = ~auVar109._8_4_ & *(uint *)(args.hit + 8);
                                auVar172._12_4_ = ~auVar109._12_4_ & *(uint *)(args.hit + 0xc);
                                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar172 | auVar124;
                                uVar39 = *(uint *)(args.hit + 0x14);
                                uVar184 = *(uint *)(args.hit + 0x18);
                                uVar186 = *(uint *)(args.hit + 0x1c);
                                *(uint *)(args.ray + 0xd0) =
                                     ~auVar109._0_4_ & *(uint *)(args.hit + 0x10) |
                                     *(uint *)(args.ray + 0xd0) & auVar109._0_4_;
                                *(uint *)(args.ray + 0xd4) =
                                     ~auVar109._4_4_ & uVar39 |
                                     *(uint *)(args.ray + 0xd4) & auVar109._4_4_;
                                *(uint *)(args.ray + 0xd8) =
                                     ~auVar109._8_4_ & uVar184 |
                                     *(uint *)(args.ray + 0xd8) & auVar109._8_4_;
                                *(uint *)(args.ray + 0xdc) =
                                     ~auVar109._12_4_ & uVar186 |
                                     *(uint *)(args.ray + 0xdc) & auVar109._12_4_;
                                auVar153._0_4_ = *(uint *)(args.ray + 0xe0) & auVar109._0_4_;
                                auVar153._4_4_ = *(uint *)(args.ray + 0xe4) & auVar109._4_4_;
                                auVar153._8_4_ = *(uint *)(args.ray + 0xe8) & auVar109._8_4_;
                                auVar153._12_4_ = *(uint *)(args.ray + 0xec) & auVar109._12_4_;
                                auVar125._0_4_ = ~auVar109._0_4_ & *(uint *)(args.hit + 0x20);
                                auVar125._4_4_ = ~auVar109._4_4_ & *(uint *)(args.hit + 0x24);
                                auVar125._8_4_ = ~auVar109._8_4_ & *(uint *)(args.hit + 0x28);
                                auVar125._12_4_ = ~auVar109._12_4_ & *(uint *)(args.hit + 0x2c);
                                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar125 | auVar153;
                                auVar163._0_4_ = *(uint *)(args.ray + 0xf0) & auVar109._0_4_;
                                auVar163._4_4_ = *(uint *)(args.ray + 0xf4) & auVar109._4_4_;
                                auVar163._8_4_ = *(uint *)(args.ray + 0xf8) & auVar109._8_4_;
                                auVar163._12_4_ = *(uint *)(args.ray + 0xfc) & auVar109._12_4_;
                                auVar126._0_4_ = ~auVar109._0_4_ & *(uint *)(args.hit + 0x30);
                                auVar126._4_4_ = ~auVar109._4_4_ & *(uint *)(args.hit + 0x34);
                                auVar126._8_4_ = ~auVar109._8_4_ & *(uint *)(args.hit + 0x38);
                                auVar126._12_4_ = ~auVar109._12_4_ & *(uint *)(args.hit + 0x3c);
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar126 | auVar163;
                                uVar39 = *(uint *)(args.hit + 0x44);
                                uVar184 = *(uint *)(args.hit + 0x48);
                                uVar186 = *(uint *)(args.hit + 0x4c);
                                *(uint *)(args.ray + 0x100) =
                                     ~auVar109._0_4_ & *(uint *)(args.hit + 0x40) |
                                     *(uint *)(args.ray + 0x100) & auVar109._0_4_;
                                *(uint *)(args.ray + 0x104) =
                                     ~auVar109._4_4_ & uVar39 |
                                     *(uint *)(args.ray + 0x104) & auVar109._4_4_;
                                *(uint *)(args.ray + 0x108) =
                                     ~auVar109._8_4_ & uVar184 |
                                     *(uint *)(args.ray + 0x108) & auVar109._8_4_;
                                *(uint *)(args.ray + 0x10c) =
                                     ~auVar109._12_4_ & uVar186 |
                                     *(uint *)(args.ray + 0x10c) & auVar109._12_4_;
                                uVar39 = *(uint *)(args.hit + 0x54);
                                uVar184 = *(uint *)(args.hit + 0x58);
                                uVar186 = *(uint *)(args.hit + 0x5c);
                                *(uint *)(args.ray + 0x110) =
                                     *(uint *)(args.ray + 0x110) & auVar109._0_4_ |
                                     ~auVar109._0_4_ & *(uint *)(args.hit + 0x50);
                                *(uint *)(args.ray + 0x114) =
                                     *(uint *)(args.ray + 0x114) & auVar109._4_4_ |
                                     ~auVar109._4_4_ & uVar39;
                                *(uint *)(args.ray + 0x118) =
                                     *(uint *)(args.ray + 0x118) & auVar109._8_4_ |
                                     ~auVar109._8_4_ & uVar184;
                                *(uint *)(args.ray + 0x11c) =
                                     *(uint *)(args.ray + 0x11c) & auVar109._12_4_ |
                                     ~auVar109._12_4_ & uVar186;
                                uVar39 = *(uint *)(args.hit + 100);
                                uVar184 = *(uint *)(args.hit + 0x68);
                                uVar186 = *(uint *)(args.hit + 0x6c);
                                *(uint *)(args.ray + 0x120) =
                                     *(uint *)(args.ray + 0x120) & auVar109._0_4_ |
                                     ~auVar109._0_4_ & *(uint *)(args.hit + 0x60);
                                *(uint *)(args.ray + 0x124) =
                                     *(uint *)(args.ray + 0x124) & auVar109._4_4_ |
                                     ~auVar109._4_4_ & uVar39;
                                *(uint *)(args.ray + 0x128) =
                                     *(uint *)(args.ray + 0x128) & auVar109._8_4_ |
                                     ~auVar109._8_4_ & uVar184;
                                *(uint *)(args.ray + 300) =
                                     *(uint *)(args.ray + 300) & auVar109._12_4_ |
                                     ~auVar109._12_4_ & uVar186;
                                auVar127._0_4_ = *(uint *)(args.ray + 0x130) & auVar109._0_4_;
                                auVar127._4_4_ = *(uint *)(args.ray + 0x134) & auVar109._4_4_;
                                auVar127._8_4_ = *(uint *)(args.ray + 0x138) & auVar109._8_4_;
                                auVar127._12_4_ = *(uint *)(args.ray + 0x13c) & auVar109._12_4_;
                                auVar145._0_4_ = ~auVar109._0_4_ & *(uint *)(args.hit + 0x70);
                                auVar145._4_4_ = ~auVar109._4_4_ & *(uint *)(args.hit + 0x74);
                                auVar145._8_4_ = ~auVar109._8_4_ & *(uint *)(args.hit + 0x78);
                                auVar145._12_4_ = ~auVar109._12_4_ & *(uint *)(args.hit + 0x7c);
                                *(undefined1 (*) [16])(args.ray + 0x130) = auVar145 | auVar127;
                                uVar39 = *(uint *)(args.hit + 0x84);
                                uVar184 = *(uint *)(args.hit + 0x88);
                                uVar186 = *(uint *)(args.hit + 0x8c);
                                *(uint *)(args.ray + 0x140) =
                                     ~auVar109._0_4_ & *(uint *)(args.hit + 0x80) |
                                     *(uint *)(args.ray + 0x140) & auVar109._0_4_;
                                *(uint *)(args.ray + 0x144) =
                                     ~auVar109._4_4_ & uVar39 |
                                     *(uint *)(args.ray + 0x144) & auVar109._4_4_;
                                *(uint *)(args.ray + 0x148) =
                                     ~auVar109._8_4_ & uVar184 |
                                     *(uint *)(args.ray + 0x148) & auVar109._8_4_;
                                *(uint *)(args.ray + 0x14c) =
                                     ~auVar109._12_4_ & uVar186 |
                                     *(uint *)(args.ray + 0x14c) & auVar109._12_4_;
                                pRVar43 = args.ray;
                                pRVar47 = (RTCIntersectArguments *)args.hit;
                              }
                            }
                            auVar83._0_4_ = auVar82._0_4_ << 0x1f;
                            auVar83._4_4_ = auVar82._4_4_ << 0x1f;
                            auVar83._8_4_ = auVar82._8_4_ << 0x1f;
                            auVar83._12_4_ = auVar82._12_4_ << 0x1f;
                            iVar45 = movmskps((int)pRVar43,auVar83);
                            if (iVar45 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = local_1348;
                            }
                            valid.field_0.v[lVar41] = 0.0;
                            fVar216 = *(float *)(ray + k * 4 + 0x80);
                            valid.field_0.i[0] =
                                 -(uint)(local_1268[0] <= fVar216) & valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(local_1268[1] <= fVar216) & valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(local_1268[2] <= fVar216) & valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(local_1268[3] <= fVar216) & valid.field_0.i[3];
                            iVar45 = movmskps(iVar45,(undefined1  [16])valid.field_0);
                            if (iVar45 != 0) {
                              auVar110._0_4_ = (uint)local_1268[0] & valid.field_0.i[0];
                              auVar110._4_4_ = (uint)local_1268[1] & valid.field_0.i[1];
                              auVar110._8_4_ = (uint)local_1268[2] & valid.field_0.i[2];
                              auVar110._12_4_ = (uint)local_1268[3] & valid.field_0.i[3];
                              auVar128._0_8_ =
                                   CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                   0x7f8000007f800000;
                              auVar128._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                              auVar128._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                              auVar128 = auVar128 | auVar110;
                              auVar146._4_4_ = auVar128._0_4_;
                              auVar146._0_4_ = auVar128._4_4_;
                              auVar146._8_4_ = auVar128._12_4_;
                              auVar146._12_4_ = auVar128._8_4_;
                              auVar61 = minps(auVar146,auVar128);
                              auVar111._0_8_ = auVar61._8_8_;
                              auVar111._8_4_ = auVar61._0_4_;
                              auVar111._12_4_ = auVar61._4_4_;
                              auVar61 = minps(auVar111,auVar61);
                              auVar112._0_8_ =
                                   CONCAT44(-(uint)(auVar61._4_4_ == auVar128._4_4_) &
                                            valid.field_0.i[1],
                                            -(uint)(auVar61._0_4_ == auVar128._0_4_) &
                                            valid.field_0.i[0]);
                              auVar112._8_4_ =
                                   -(uint)(auVar61._8_4_ == auVar128._8_4_) & valid.field_0.i[2];
                              auVar112._12_4_ =
                                   -(uint)(auVar61._12_4_ == auVar128._12_4_) & valid.field_0.i[3];
                              iVar46 = movmskps((int)pRVar47,auVar112);
                              aVar84 = valid.field_0;
                              if (iVar46 != 0) {
                                aVar84.i[2] = auVar112._8_4_;
                                aVar84._0_8_ = auVar112._0_8_;
                                aVar84.i[3] = auVar112._12_4_;
                              }
                              uVar38 = movmskps(iVar46,(undefined1  [16])aVar84);
                              uVar48 = CONCAT44((int)((ulong)pRVar47 >> 0x20),uVar38);
                              lVar41 = 0;
                              if (uVar48 != 0) {
                                for (; (uVar48 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                                }
                              }
                            }
                          } while ((char)iVar45 != '\0');
                        }
                      }
                    }
                  }
                }
                uVar55 = uVar55 & uVar55 - 1;
              } while (uVar55 != 0);
            }
            local_1110 = local_1110 + 1;
          } while (local_1110 != local_1130);
        }
        local_11e8 = *(int *)(ray + k * 4 + 0x80);
        iStack_11e4 = local_11e8;
        iStack_11e0 = local_11e8;
        iStack_11dc = local_11e8;
        uVar55 = local_1178;
        uVar48 = local_1188;
        uVar52 = local_1180;
        fVar216 = local_1228;
        fVar154 = fStack_1224;
        fVar195 = fStack_1220;
        fVar191 = fStack_121c;
        fVar197 = local_11f8;
        fVar194 = fStack_11f4;
        fVar168 = fStack_11f0;
        fVar174 = fStack_11ec;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }